

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>::
emplaceRealloc<slang::ast::CheckerInstanceBodySymbol&,slang::ast::Symbol_const&,slang::syntax::ExpressionSyntax_const*&,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>&>
          (SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> *this,pointer pos,
          CheckerInstanceBodySymbol *args,Symbol *args_1,ExpressionSyntax **args_2,
          span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *args_3)

{
  ulong uVar1;
  ExpressionSyntax *pEVar2;
  pointer ppAVar3;
  size_t sVar4;
  pointer pCVar5;
  undefined8 *puVar6;
  pointer pCVar7;
  long lVar8;
  pointer ctx;
  pointer pCVar9;
  pointer pCVar10;
  pointer pCVar11;
  undefined8 *puVar12;
  pointer pCVar13;
  long lVar14;
  pointer pCVar15;
  byte bVar16;
  
  bVar16 = 0;
  if (this->len == 0x1c71c71c71c71c7) {
    detail::throwLengthError();
  }
  pCVar15 = (pointer)(this->len + 1);
  uVar1 = this->cap;
  ctx = (pointer)(uVar1 * 2);
  if (pCVar15 < ctx) {
    pCVar15 = ctx;
  }
  if (0x1c71c71c71c71c7 - uVar1 < uVar1) {
    pCVar15 = (pointer)0x1c71c71c71c71c7;
  }
  lVar14 = (long)pos - (long)this->data_;
  pCVar5 = (pointer)operator_new((long)pCVar15 * 0x48);
  pEVar2 = *args_2;
  ppAVar3 = args_3->_M_ptr;
  sVar4 = (args_3->_M_extent)._M_extent_value;
  *(CheckerInstanceBodySymbol **)((long)pCVar5 + lVar14) = args;
  *(Symbol **)((long)pCVar5 + lVar14 + 8) = args_1;
  *(undefined8 *)((long)pCVar5 + lVar14 + 0x10) = 0;
  *(undefined1 *)((long)pCVar5 + lVar14 + 0x18) = 0;
  puVar6 = (undefined8 *)((long)pCVar5 + lVar14 + 0x20);
  *puVar6 = ppAVar3;
  puVar6[1] = sVar4;
  *(ExpressionSyntax **)((long)pCVar5 + lVar14 + 0x30) = pEVar2;
  *(undefined1 *)((long)pCVar5 + lVar14 + 0x40) = 0;
  pCVar7 = this->data_;
  pCVar10 = pCVar7 + this->len;
  pCVar13 = pCVar5;
  if (pCVar10 == pos) {
    for (; lVar8 = 9, pCVar10 = pCVar7, pCVar9 = pCVar13, pCVar7 != pos; pCVar7 = pCVar7 + 1) {
      for (; lVar8 != 0; lVar8 = lVar8 + -1) {
        pCVar9->parent = pCVar10->parent;
        pCVar10 = (pointer)((long)pCVar10 + (ulong)bVar16 * -0x10 + 8);
        pCVar9 = (pointer)((long)pCVar9 + ((ulong)bVar16 * -2 + 1) * 8);
      }
      ctx = pCVar10;
      pCVar13 = pCVar13 + 1;
    }
  }
  else {
    for (; lVar8 = 9, pCVar9 = pCVar7, pCVar11 = pCVar13, pCVar7 != pos; pCVar7 = pCVar7 + 1) {
      for (; lVar8 != 0; lVar8 = lVar8 + -1) {
        pCVar11->parent = pCVar9->parent;
        pCVar9 = (pointer)((long)pCVar9 + (ulong)bVar16 * -0x10 + 8);
        pCVar11 = (pointer)((long)pCVar11 + ((ulong)bVar16 * -2 + 1) * 8);
      }
      pCVar13 = pCVar13 + 1;
      ctx = pCVar9;
    }
    puVar6 = (undefined8 *)(lVar14 + (long)pCVar5);
    for (; puVar6 = puVar6 + 9, lVar8 = 9, pCVar7 = pos, puVar12 = puVar6, pos != pCVar10;
        pos = pos + 1) {
      for (; lVar8 != 0; lVar8 = lVar8 + -1) {
        *puVar12 = pCVar7->parent;
        pCVar7 = (pointer)((long)pCVar7 + (ulong)bVar16 * -0x10 + 8);
        puVar12 = puVar12 + (ulong)bVar16 * -2 + 1;
      }
      ctx = pCVar7;
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pCVar15;
  this->data_ = pCVar5;
  return (pointer)((long)pCVar5 + lVar14);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}